

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truc_policy.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
PackageTRUCChecks_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,CTransactionRef *ptx,int64_t vsize,Package *package,
          setEntries *mempool_ancestors)

{
  Wtxid *this;
  Txid *this_00;
  element_type *peVar1;
  size_t sVar2;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer psVar4;
  pointer pCVar5;
  bool bVar6;
  value_type *parent_index;
  _Base_ptr p_Var7;
  const_reference pvVar8;
  long lVar9;
  pointer psVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  size_type *psVar12;
  pointer this_01;
  long in_FS_OFFSET;
  bool bVar13;
  vector<unsigned_long,_std::allocator<unsigned_long>_> in_package_parents;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_118;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_108;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  undefined1 local_e0 [8];
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)mempool_ancestors;
  local_e0 = (undefined1  [8])vsize;
  FindInPackageParents
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8,package,ptx);
  peVar1 = (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1->version != 3) {
    for (p_Var7 = (mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        psVar12 = local_f8._M_impl.super__Vector_impl_data._M_start,
        (_Rb_tree_header *)p_Var7 != &(mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7)) {
      p_Var3 = *(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> **)(p_Var7 + 1);
      if (p_Var3->_M_ptr->version == 3) {
        base_blob<256u>::ToString_abi_cxx11_(&local_78,(base_blob<256u> *)&peVar1->hash);
        base_blob<256u>::ToString_abi_cxx11_
                  (&local_98,
                   (base_blob<256u> *)
                   &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->m_witness_hash);
        std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_108,p_Var3);
        base_blob<256u>::ToString_abi_cxx11_(&local_b8,(base_blob<256u> *)&(local_108._M_ptr)->hash)
        ;
        std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_118,p_Var3);
        base_blob<256u>::ToString_abi_cxx11_
                  ((string *)(local_e0 + 8),(base_blob<256u> *)&(local_118._M_ptr)->m_witness_hash);
        tinyformat::
        format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (&local_58,
                   (tinyformat *)
                   "non-version=3 tx %s (wtxid=%s) cannot spend from version=3 tx %s (wtxid=%s)",
                   (char *)&local_78,&local_98,&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_e0 + 8),in_stack_fffffffffffffec8);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (__return_storage_ptr__,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)(local_e0 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
        goto LAB_003e0e61;
      }
    }
    for (; psVar12 != local_f8._M_impl.super__Vector_impl_data._M_finish; psVar12 = psVar12 + 1) {
      pvVar8 = std::
               vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ::at(package,*psVar12);
      if (((pvVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          version == 3) {
        base_blob<256u>::ToString_abi_cxx11_
                  (&local_78,
                   (base_blob<256u> *)
                   &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->hash);
        base_blob<256u>::ToString_abi_cxx11_
                  (&local_98,
                   (base_blob<256u> *)
                   &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->m_witness_hash);
        pvVar8 = std::
                 vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ::at(package,*psVar12);
        base_blob<256u>::ToString_abi_cxx11_
                  (&local_b8,
                   (base_blob<256u> *)
                   &((pvVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->hash);
        pvVar8 = std::
                 vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ::at(package,*psVar12);
        base_blob<256u>::ToString_abi_cxx11_
                  ((string *)(local_e0 + 8),
                   (base_blob<256u> *)
                   &((pvVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->m_witness_hash);
        tinyformat::
        format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (&local_58,
                   (tinyformat *)
                   "non-version=3 tx %s (wtxid=%s) cannot spend from version=3 tx %s (wtxid=%s)",
                   (char *)&local_78,&local_98,&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_e0 + 8),in_stack_fffffffffffffec8);
        goto LAB_003e0e2f;
      }
    }
LAB_003e0d90:
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    goto LAB_003e0e7b;
  }
  if (vsize < 0x2711) {
    sVar2 = (mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    lVar9 = (long)local_f8._M_impl.super__Vector_impl_data._M_finish -
            (long)local_f8._M_impl.super__Vector_impl_data._M_start >> 3;
    if ((sVar2 + lVar9) - 2 < 0xfffffffffffffffd) {
      base_blob<256u>::ToString_abi_cxx11_(&local_78,(base_blob<256u> *)&peVar1->hash);
      base_blob<256u>::ToString_abi_cxx11_
                (&local_98,
                 (base_blob<256u> *)
                 &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->m_witness_hash);
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                (&local_58,(tinyformat *)"tx %s (wtxid=%s) would have too many ancestors",
                 (char *)&local_78,&local_98,pbVar11);
      goto LAB_003e0c83;
    }
    if (lVar9 + sVar2 == 0) goto LAB_003e0d90;
    if (1000 < vsize) {
      base_blob<256u>::ToString_abi_cxx11_(&local_78,(base_blob<256u> *)&peVar1->hash);
      base_blob<256u>::ToString_abi_cxx11_
                (&local_98,
                 (base_blob<256u> *)
                 &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->m_witness_hash);
      tinyformat::format<std::__cxx11::string,std::__cxx11::string,long,long>
                (&local_58,
                 (tinyformat *)"version=3 child tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
                 (char *)&local_78,&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 &TRUC_CHILD_MAX_VSIZE,(long *)in_stack_fffffffffffffec8);
      goto LAB_003e0c83;
    }
    if (sVar2 == 0) {
      pvVar8 = std::
               vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ::at(package,*local_f8._M_impl.super__Vector_impl_data._M_start);
      bVar13 = false;
    }
    else {
      pvVar8 = *(const_reference *)
                ((mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left + 1);
      bVar13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000001 <
               pvVar8[0xc].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    }
    peVar1 = (pvVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this = &peVar1->m_witness_hash;
    this_00 = &peVar1->hash;
    if (peVar1->version == 3) {
      psVar4 = (package->
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (psVar10 = (package->
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; psVar10 != psVar4;
          psVar10 = psVar10 + 1) {
        peVar1 = (psVar10->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (peVar1 != (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr) {
          this_01 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pCVar5 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          while (this_01 != pCVar5) {
            bVar6 = transaction_identifier<false>::operator==
                              ((transaction_identifier<false> *)this_01,this_00);
            if (bVar6) {
              base_blob<256u>::ToString_abi_cxx11_(&local_78,(base_blob<256u> *)this_00);
              base_blob<256u>::ToString_abi_cxx11_(&local_98,(base_blob<256u> *)this);
              tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                        (&local_58,
                         (tinyformat *)"tx %s (wtxid=%s) would exceed descendant count limit",
                         (char *)&local_78,&local_98,pbVar11);
              goto LAB_003e0c83;
            }
            bVar6 = transaction_identifier<false>::operator==
                              ((transaction_identifier<false> *)this_01,
                               &((ptx->
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                                ._M_ptr)->hash);
            this_01 = this_01 + 1;
            if (bVar6) {
              base_blob<256u>::ToString_abi_cxx11_
                        (&local_78,
                         (base_blob<256u> *)
                         &((psVar10->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->hash);
              base_blob<256u>::ToString_abi_cxx11_
                        (&local_98,
                         (base_blob<256u> *)
                         &((psVar10->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->m_witness_hash);
              tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                        (&local_58,(tinyformat *)"tx %s (wtxid=%s) would have too many ancestors",
                         (char *)&local_78,&local_98,pbVar11);
              goto LAB_003e0c83;
            }
          }
        }
      }
      if (!bVar13) goto LAB_003e0d90;
      base_blob<256u>::ToString_abi_cxx11_(&local_78,(base_blob<256u> *)this_00);
      base_blob<256u>::ToString_abi_cxx11_(&local_98,(base_blob<256u> *)this);
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                (&local_58,(tinyformat *)"tx %s (wtxid=%s) would exceed descendant count limit",
                 (char *)&local_78,&local_98,pbVar11);
      goto LAB_003e0c83;
    }
    base_blob<256u>::ToString_abi_cxx11_
              (&local_78,
               (base_blob<256u> *)
               &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                hash);
    base_blob<256u>::ToString_abi_cxx11_
              (&local_98,
               (base_blob<256u> *)
               &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                m_witness_hash);
    base_blob<256u>::ToString_abi_cxx11_(&local_b8,(base_blob<256u> *)this_00);
    base_blob<256u>::ToString_abi_cxx11_((string *)(local_e0 + 8),(base_blob<256u> *)this);
    tinyformat::
    format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (&local_58,
               (tinyformat *)
               "version=3 tx %s (wtxid=%s) cannot spend from non-version=3 tx %s (wtxid=%s)",
               (char *)&local_78,&local_98,&local_b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_e0 + 8),
               in_stack_fffffffffffffec8);
LAB_003e0e2f:
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)(local_e0 + 8));
    pbVar11 = &local_b8;
  }
  else {
    base_blob<256u>::ToString_abi_cxx11_(&local_78,(base_blob<256u> *)&peVar1->hash);
    base_blob<256u>::ToString_abi_cxx11_
              (&local_98,
               (base_blob<256u> *)
               &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                m_witness_hash);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string,long,long>
              (&local_58,
               (tinyformat *)"version=3 tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
               (char *)&local_78,&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
               &TRUC_MAX_VSIZE,(long *)in_stack_fffffffffffffec8);
LAB_003e0c83:
    pbVar11 = &local_58;
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,pbVar11);
  }
  std::__cxx11::string::~string((string *)pbVar11);
LAB_003e0e61:
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
LAB_003e0e7b:
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> PackageTRUCChecks(const CTransactionRef& ptx, int64_t vsize,
                                           const Package& package,
                                           const CTxMemPool::setEntries& mempool_ancestors)
{
    // This function is specialized for these limits, and must be reimplemented if they ever change.
    static_assert(TRUC_ANCESTOR_LIMIT == 2);
    static_assert(TRUC_DESCENDANT_LIMIT == 2);

    const auto in_package_parents{FindInPackageParents(package, ptx)};

    // Now we have all ancestors, so we can start checking TRUC rules.
    if (ptx->version == TRUC_VERSION) {
        // SingleTRUCChecks should have checked this already.
        if (!Assume(vsize <= TRUC_MAX_VSIZE)) {
            return strprintf("version=3 tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
                             ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(), vsize, TRUC_MAX_VSIZE);
        }

        if (mempool_ancestors.size() + in_package_parents.size() + 1 > TRUC_ANCESTOR_LIMIT) {
            return strprintf("tx %s (wtxid=%s) would have too many ancestors",
                             ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString());
        }

        const bool has_parent{mempool_ancestors.size() + in_package_parents.size() > 0};
        if (has_parent) {
            // A TRUC child cannot be too large.
            if (vsize > TRUC_CHILD_MAX_VSIZE) {
                return strprintf("version=3 child tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
                                 ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(),
                                 vsize, TRUC_CHILD_MAX_VSIZE);
            }

            // Exactly 1 parent exists, either in mempool or package. Find it.
            const auto parent_info = [&] {
                if (mempool_ancestors.size() > 0) {
                    auto& mempool_parent = *mempool_ancestors.begin();
                    return ParentInfo{mempool_parent->GetTx().GetHash(),
                                      mempool_parent->GetTx().GetWitnessHash(),
                                      mempool_parent->GetTx().version,
                                      /*has_mempool_descendant=*/mempool_parent->GetCountWithDescendants() > 1};
                } else {
                    auto& parent_index = in_package_parents.front();
                    auto& package_parent = package.at(parent_index);
                    return ParentInfo{package_parent->GetHash(),
                                      package_parent->GetWitnessHash(),
                                      package_parent->version,
                                      /*has_mempool_descendant=*/false};
                }
            }();

            // If there is a parent, it must have the right version.
            if (parent_info.m_version != TRUC_VERSION) {
                return strprintf("version=3 tx %s (wtxid=%s) cannot spend from non-version=3 tx %s (wtxid=%s)",
                                 ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(),
                                 parent_info.m_txid.ToString(), parent_info.m_wtxid.ToString());
            }

            for (const auto& package_tx : package) {
                // Skip same tx.
                if (&(*package_tx) == &(*ptx)) continue;

                for (auto& input : package_tx->vin) {
                    // Fail if we find another tx with the same parent. We don't check whether the
                    // sibling is to-be-replaced (done in SingleTRUCChecks) because these transactions
                    // are within the same package.
                    if (input.prevout.hash == parent_info.m_txid) {
                        return strprintf("tx %s (wtxid=%s) would exceed descendant count limit",
                                         parent_info.m_txid.ToString(),
                                         parent_info.m_wtxid.ToString());
                    }

                    // This tx can't have both a parent and an in-package child.
                    if (input.prevout.hash == ptx->GetHash()) {
                        return strprintf("tx %s (wtxid=%s) would have too many ancestors",
                                         package_tx->GetHash().ToString(), package_tx->GetWitnessHash().ToString());
                    }
                }
            }

            if (parent_info.m_has_mempool_descendant) {
                return strprintf("tx %s (wtxid=%s) would exceed descendant count limit",
                                parent_info.m_txid.ToString(), parent_info.m_wtxid.ToString());
            }
        }
    } else {
        // Non-TRUC transactions cannot have TRUC parents.
        for (auto it : mempool_ancestors) {
            if (it->GetTx().version == TRUC_VERSION) {
                return strprintf("non-version=3 tx %s (wtxid=%s) cannot spend from version=3 tx %s (wtxid=%s)",
                                 ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(),
                                 it->GetSharedTx()->GetHash().ToString(), it->GetSharedTx()->GetWitnessHash().ToString());
            }
        }
        for (const auto& index: in_package_parents) {
            if (package.at(index)->version == TRUC_VERSION) {
                return strprintf("non-version=3 tx %s (wtxid=%s) cannot spend from version=3 tx %s (wtxid=%s)",
                                 ptx->GetHash().ToString(),
                                 ptx->GetWitnessHash().ToString(),
                                 package.at(index)->GetHash().ToString(),
                                 package.at(index)->GetWitnessHash().ToString());
            }
        }
    }
    return std::nullopt;
}